

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction_selection.cpp
# Opt level: O0

string * mocker::anon_unknown_0::renameIdentifier(string *__return_storage_ptr__,string *ident)

{
  bool bVar1;
  reference pcVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_38;
  char ch;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  string *ident_local;
  string *res;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end2._M_current = (char *)std::__cxx11::string::begin();
  _Stack_38._M_current = (char *)std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffc8), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
    if (*pcVar2 == '#') {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"__");
    }
    else {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string renameIdentifier(const std::string &ident) {
  std::string res;
  for (auto ch : ident) {
    if (ch == '#') {
      res += "__";
      continue;
    }
    res.push_back(ch);
  }
  return res;
}